

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitL(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  
  iVar2 = this->u;
  iVar3 = this->uw;
  if (-iVar2 < iVar3) {
    bVar1 = (this->res).ulog2;
    iVar3 = this->v;
    iVar4 = this->vw;
    pfVar7 = this->ku;
    pfVar8 = this->kv;
    k->res = this->res;
    k->u = (1 << (bVar1 & 0x1f)) + iVar2;
    k->v = iVar3;
    k->uw = -iVar2;
    k->vw = iVar4;
    memcpy(k->kubuff,pfVar7,(long)iVar2 * -4);
    memcpy(k->kvbuff,pfVar8,(long)iVar4 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    this->u = 0;
    this->uw = this->uw + iVar2;
    this->ku = this->ku + -(long)iVar2;
  }
  else {
    iVar4 = this->v;
    iVar5 = this->vw;
    pfVar7 = this->ku;
    pfVar8 = this->kv;
    iVar6 = this->rot;
    k->res = this->res;
    k->u = iVar2;
    k->v = iVar4;
    k->uw = iVar3;
    k->vw = iVar5;
    memcpy(k->kubuff,pfVar7,(long)iVar3 << 2);
    memcpy(k->kvbuff,pfVar8,(long)iVar5 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = iVar6;
    k->u = (1 << ((this->res).ulog2 & 0x1fU)) + iVar2;
    this->u = 0;
    this->uw = 0;
  }
  return;
}

Assistant:

void splitL(PtexSeparableKernel& k)
    {
        // split off left piece of width w into k
        int w = -u;

        if (w < uw) {
            // normal case - split off a portion
            //    res  u          v  uw vw  ku  kv
            k.set(res, res.u()-w, v, w, vw, ku, kv);

            // update local
            u = 0;
            uw -= w;
            ku += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u += res.u();
            u = 0; uw = 0;
        }
    }